

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asdcp-test.cpp
# Opt level: O1

CommandOptions * read_JP2K_S_file(CommandOptions *Options,IFileReaderFactory *fileReaderFactory)

{
  Result_t *this;
  uint uVar1;
  AESDecContext *this_00;
  HMACContext *this_01;
  size_t sVar2;
  IFileReaderFactory *in_RDX;
  uint uVar3;
  uint uVar4;
  MXFSReader Reader;
  ui32_t write_count;
  FrameBuffer FrameBuffer;
  FileWriter OutFile;
  char right_format [64];
  char left_format [64];
  char filename [1024];
  long *local_688 [2];
  long local_678 [2];
  MXFSReader local_668 [24];
  undefined1 local_650 [144];
  FileWriter local_5c0 [56];
  char local_588 [64];
  char local_548 [64];
  undefined1 local_508 [72];
  _Alloc_hider local_4c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4b0;
  _Alloc_hider local_4a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_490;
  _Alloc_hider local_480;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_470 [55];
  undefined1 local_100 [104];
  
  ASDCP::JP2K::MXFSReader::MXFSReader(local_668,in_RDX);
  ASDCP::JP2K::FrameBuffer::FrameBuffer
            ((FrameBuffer *)local_650,*(ui32_t *)&fileReaderFactory[6]._vptr_IFileReaderFactory);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_508,(char *)fileReaderFactory[0xf]._vptr_IFileReaderFactory,
             (allocator<char> *)(local_650 + 0x28));
  ASDCP::JP2K::MXFSReader::OpenRead((string *)Options);
  if (local_508._0_8_ != (long)local_508 + 0x10) {
    operator_delete((void *)local_508._0_8_,CONCAT44(local_508._20_4_,local_508._16_4_) + 1);
  }
  if ((int)Options->mode < 0) {
    uVar3 = 0;
  }
  else {
    local_508._0_4_ = 0;
    local_508._4_4_ = 0;
    local_508._12_4_ = 0;
    local_508._16_4_ = 0;
    local_508._28_4_ = 0;
    local_508._32_4_ = 0;
    ASDCP::JP2K::MXFSReader::FillPictureDescriptor((PictureDescriptor *)&stack0xffffffffffffff68);
    Kumu::Result_t::~Result_t((Result_t *)&stack0xffffffffffffff68);
    uVar3 = local_508._8_4_;
    if (*(char *)((long)&fileReaderFactory[1]._vptr_IFileReaderFactory + 5) == '\x01') {
      fprintf(_stderr,"Frame Buffer size: %u\n",
              (ulong)*(uint *)&fileReaderFactory[6]._vptr_IFileReaderFactory);
      ASDCP::JP2K::PictureDescriptorDump((PictureDescriptor *)local_508,(_IO_FILE *)0x0);
    }
  }
  if ((-1 < (int)Options->mode) &&
     (*(char *)((long)&fileReaderFactory->_vptr_IFileReaderFactory + 5) == '\x01')) {
    this_00 = (AESDecContext *)operator_new(8);
    ASDCP::AESDecContext::AESDecContext(this_00);
    ASDCP::AESDecContext::InitKey(local_508);
    Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_508);
    Kumu::Result_t::~Result_t((Result_t *)local_508);
    if ((-1 < (int)Options->mode) &&
       (*(char *)((long)&fileReaderFactory[1]._vptr_IFileReaderFactory + 2) == '\x01')) {
      ASDCP::WriterInfo::WriterInfo((WriterInfo *)local_508);
      ASDCP::JP2K::MXFSReader::FillWriterInfo((WriterInfo *)local_100);
      Kumu::Result_t::~Result_t((Result_t *)local_100);
      if (local_508[0x41] == true) {
        this_01 = (HMACContext *)operator_new(8);
        ASDCP::HMACContext::HMACContext(this_01);
        ASDCP::HMACContext::InitKey(local_650 + 0x28,(LabelSet_t)this_01);
        Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)(local_650 + 0x28));
        Kumu::Result_t::~Result_t((Result_t *)(local_650 + 0x28));
      }
      else {
        read_JP2K_S_file();
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_480._M_p != local_470) {
        operator_delete(local_480._M_p,local_470[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4a0._M_p != &local_490) {
        operator_delete(local_4a0._M_p,local_490._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4c0._M_p != &local_4b0) {
        operator_delete(local_4c0._M_p,local_4b0._M_allocated_capacity + 1);
      }
    }
  }
  uVar1 = *(uint *)((long)&fileReaderFactory[4]._vptr_IFileReaderFactory + 4);
  if (uVar1 == 0) {
    uVar1 = uVar3;
  }
  uVar1 = uVar1 + *(int *)&fileReaderFactory[4]._vptr_IFileReaderFactory;
  if (uVar3 <= uVar1) {
    uVar1 = uVar3;
  }
  snprintf(local_548,0x40,"%%s%%0%duL.j2c",
           (ulong)*(uint *)((long)&fileReaderFactory[3]._vptr_IFileReaderFactory + 4));
  snprintf(local_588,0x40,"%%s%%0%duR.j2c");
  if ((-1 < (int)Options->mode) &&
     (uVar3 = *(uint *)&fileReaderFactory[4]._vptr_IFileReaderFactory, uVar3 < uVar1)) {
    this = (Result_t *)(local_650 + 0x28);
    do {
      ASDCP::JP2K::MXFSReader::ReadFrame
                ((uint)this,(StereoscopicPhase_t)local_668,(FrameBuffer *)(ulong)uVar3,
                 (AESDecContext *)0x0,(HMACContext *)local_650);
      Kumu::Result_t::operator=((Result_t *)Options,this);
      Kumu::Result_t::~Result_t(this);
      uVar4 = (uint)local_5c0;
      if (-1 < (int)Options->mode) {
        Kumu::FileWriter::FileWriter(local_5c0);
        snprintf(local_508,0x400,local_548,fileReaderFactory[7]._vptr_IFileReaderFactory,
                 (ulong)uVar3);
        local_688[0] = local_678;
        sVar2 = strlen(local_508);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_688,local_508,local_508 + sVar2);
        Kumu::FileWriter::OpenWrite((string *)this);
        Kumu::Result_t::operator=((Result_t *)Options,this);
        Kumu::Result_t::~Result_t(this);
        if (local_688[0] != local_678) {
          operator_delete(local_688[0],local_678[0] + 1);
        }
        if (-1 < (int)Options->mode) {
          Kumu::FileWriter::Write((uchar *)this,uVar4,(uint *)local_650._8_8_);
          Kumu::Result_t::operator=((Result_t *)Options,this);
          Kumu::Result_t::~Result_t(this);
        }
        if (*(char *)((long)&fileReaderFactory[1]._vptr_IFileReaderFactory + 5) == '\x01') {
          ASDCP::JP2K::FrameBuffer::Dump((_IO_FILE *)local_650,(uint)_stderr);
        }
        Kumu::FileWriter::~FileWriter(local_5c0);
      }
      if (-1 < (int)Options->mode) {
        ASDCP::JP2K::MXFSReader::ReadFrame
                  ((uint)this,(StereoscopicPhase_t)local_668,(FrameBuffer *)(ulong)uVar3,
                   (AESDecContext *)0x1,(HMACContext *)local_650);
        Kumu::Result_t::operator=((Result_t *)Options,this);
        Kumu::Result_t::~Result_t(this);
      }
      if (-1 < (int)Options->mode) {
        Kumu::FileWriter::FileWriter(local_5c0);
        snprintf(local_508,0x400,local_588,fileReaderFactory[7]._vptr_IFileReaderFactory,
                 (ulong)uVar3);
        local_688[0] = local_678;
        sVar2 = strlen(local_508);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_688,local_508,local_508 + sVar2);
        Kumu::FileWriter::OpenWrite((string *)this);
        Kumu::Result_t::operator=((Result_t *)Options,this);
        Kumu::Result_t::~Result_t(this);
        if (local_688[0] != local_678) {
          operator_delete(local_688[0],local_678[0] + 1);
        }
        if (-1 < (int)Options->mode) {
          Kumu::FileWriter::Write((uchar *)this,uVar4,(uint *)local_650._8_8_);
          Kumu::Result_t::operator=((Result_t *)Options,this);
          Kumu::Result_t::~Result_t(this);
        }
        Kumu::FileWriter::~FileWriter(local_5c0);
      }
    } while ((-1 < (int)Options->mode) && (uVar3 = uVar3 + 1, uVar3 < uVar1));
  }
  ASDCP::FrameBuffer::~FrameBuffer((FrameBuffer *)local_650);
  ASDCP::JP2K::MXFSReader::~MXFSReader(local_668);
  return Options;
}

Assistant:

Result_t
read_JP2K_S_file(CommandOptions& Options, const Kumu::IFileReaderFactory& fileReaderFactory)
{
  AESDecContext*     Context = 0;
  HMACContext*       HMAC = 0;
  JP2K::MXFSReader    Reader(fileReaderFactory);
  JP2K::FrameBuffer  FrameBuffer(Options.fb_size);
  ui32_t             frame_count = 0;

  Result_t result = Reader.OpenRead(Options.filenames[0]);

  if ( ASDCP_SUCCESS(result) )
    {
      JP2K::PictureDescriptor PDesc;
      Reader.FillPictureDescriptor(PDesc);

      frame_count = PDesc.ContainerDuration;

      if ( Options.verbose_flag )
	{
	  fprintf(stderr, "Frame Buffer size: %u\n", Options.fb_size);
	  JP2K::PictureDescriptorDump(PDesc);
	}
    }

#ifdef HAVE_OPENSSL
  if ( ASDCP_SUCCESS(result) && Options.key_flag )
    {
      Context = new AESDecContext;
      result = Context->InitKey(Options.key_value);

      if ( ASDCP_SUCCESS(result) && Options.read_hmac )
	{
	  WriterInfo Info;
	  Reader.FillWriterInfo(Info);

	  if ( Info.UsesHMAC )
	    {
	      HMAC = new HMACContext;
	      result = HMAC->InitKey(Options.key_value, Info.LabelSetType);
	    }
	  else
	    {
	      fputs("File does not contain HMAC values, ignoring -m option.\n", stderr);
	    }
	}
    }
#endif // HAVE_OPENSSL

  const int filename_max = 1024;
  char filename[filename_max];
  ui32_t last_frame = Options.start_frame + ( Options.duration ? Options.duration : frame_count);
  if ( last_frame > frame_count )
    last_frame = frame_count;

  char left_format[64];  char right_format[64];
  snprintf(left_format,  64, "%%s%%0%duL.j2c", Options.number_width);
  snprintf(right_format, 64, "%%s%%0%duR.j2c", Options.number_width);

  for ( ui32_t i = Options.start_frame; ASDCP_SUCCESS(result) && i < last_frame; i++ )
    {
      result = Reader.ReadFrame(i, JP2K::SP_LEFT, FrameBuffer, Context, HMAC);

      if ( ASDCP_SUCCESS(result) )
	{
	  Kumu::FileWriter OutFile;
	  ui32_t write_count;
	  snprintf(filename, filename_max, left_format, Options.file_root, i);
	  result = OutFile.OpenWrite(filename);

	  if ( ASDCP_SUCCESS(result) )
	    result = OutFile.Write(FrameBuffer.Data(), FrameBuffer.Size(), &write_count);

	  if ( Options.verbose_flag )
	    FrameBuffer.Dump(stderr, Options.fb_dump_size);
	}

      if ( ASDCP_SUCCESS(result) )
	result = Reader.ReadFrame(i, JP2K::SP_RIGHT, FrameBuffer, Context, HMAC);

      if ( ASDCP_SUCCESS(result) )
	{
	  Kumu::FileWriter OutFile;
	  ui32_t write_count;
	  snprintf(filename, filename_max, right_format, Options.file_root, i);
	  result = OutFile.OpenWrite(filename);

	  if ( ASDCP_SUCCESS(result) )
	    result = OutFile.Write(FrameBuffer.Data(), FrameBuffer.Size(), &write_count);
	}
    }

  return result;
}